

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<char_*,_char>_>::write_decimal<unsigned_long_long>
          (basic_writer<fmt::v5::output_range<char_*,_char>_> *this,unsigned_long_long value)

{
  type_conflict4 tVar1;
  char **ppcVar2;
  char *pcVar3;
  unsigned_long_long in_RSI;
  basic_writer<fmt::v5::output_range<char_*,_char>_> *in_RDI;
  char **it;
  int num_digits;
  bool is_negative;
  main_type abs_value;
  unsigned_long in_stack_ffffffffffffffc8;
  uint64_t local_18;
  
  tVar1 = internal::is_negative<unsigned_long_long>(in_RSI);
  local_18 = in_RSI;
  if (tVar1) {
    local_18 = -in_RSI;
  }
  internal::count_digits(local_18);
  ppcVar2 = reserve(in_RDI,in_stack_ffffffffffffffc8);
  if (tVar1) {
    pcVar3 = *ppcVar2;
    *ppcVar2 = pcVar3 + 1;
    *pcVar3 = '-';
  }
  pcVar3 = internal::format_decimal<char,char*,unsigned_long>
                     ((char *)in_RDI,in_stack_ffffffffffffffc8,0);
  *ppcVar2 = pcVar3;
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }